

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O2

int Map_CutMergeTwo(Map_Cut_t *pCut1,Map_Cut_t *pCut2,Map_Node_t **ppNodes,int nNodesMax)

{
  Map_Node_t **ppMVar1;
  Map_Node_t **ppMVar2;
  Map_Node_t *pMVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  bool bVar13;
  
  uVar5 = (uint)pCut1->nLeaves;
  if (uVar5 == nNodesMax) {
    uVar9 = (uint)pCut2->nLeaves;
    if (uVar9 == nNodesMax) {
      uVar6 = 0;
      uVar8 = 0;
      if (0 < nNodesMax) {
        uVar6 = (ulong)(uint)nNodesMax;
      }
      do {
        if (uVar6 == uVar8) {
          for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
            ppNodes[uVar8] = pCut1->ppLeaves[uVar8];
          }
          return nNodesMax;
        }
        ppMVar1 = pCut1->ppLeaves + uVar8;
        ppMVar2 = pCut2->ppLeaves + uVar8;
        uVar8 = uVar8 + 1;
      } while (*ppMVar1 == *ppMVar2);
    }
    else {
      if (nNodesMax - 1U != uVar9) goto LAB_00345294;
      uVar6 = 0;
      uVar8 = 0;
      if (0 < nNodesMax) {
        uVar8 = (ulong)(uint)nNodesMax;
      }
      iVar12 = 0;
      while( true ) {
        if (uVar8 == uVar6) {
          for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
            ppNodes[uVar6] = pCut1->ppLeaves[uVar6];
          }
          return nNodesMax;
        }
        if ((pCut1->ppLeaves[uVar6] !=
             *(Map_Node_t **)((long)pCut2 + uVar6 * 8 + (long)iVar12 * -8 + 0x18)) &&
           (bVar13 = iVar12 == 1, iVar12 = 1, bVar13)) break;
        uVar6 = uVar6 + 1;
      }
    }
  }
  else {
    uVar9 = (uint)pCut2->nLeaves;
    if (uVar9 != nNodesMax || nNodesMax - 1U != uVar5) {
LAB_00345294:
      uVar6 = 0;
      uVar8 = 0;
      if ('\0' < pCut1->nLeaves) {
        uVar8 = (ulong)uVar5;
      }
      uVar10 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar10 = uVar6;
      }
      do {
        if (uVar6 == uVar10) {
          for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
            ppNodes[uVar6] = pCut1->ppLeaves[uVar6];
          }
          uVar9 = 1;
          if (1 < (int)uVar5) {
            uVar9 = uVar5;
          }
          uVar8 = 1;
          for (uVar6 = 0; uVar6 != uVar9 - 1; uVar6 = uVar6 + 1) {
            uVar11 = uVar6 & 0xffffffff;
            for (uVar10 = uVar8; iVar12 = (int)uVar11, (int)uVar10 < (int)uVar5; uVar10 = uVar10 + 1
                ) {
              uVar4 = uVar10 & 0xffffffff;
              if (ppNodes[iVar12]->Num <= ppNodes[uVar10]->Num) {
                uVar4 = uVar11;
              }
              uVar11 = uVar4;
            }
            pMVar3 = ppNodes[uVar6];
            ppNodes[uVar6] = ppNodes[iVar12];
            ppNodes[iVar12] = pMVar3;
            uVar8 = uVar8 + 1;
          }
          return uVar5;
        }
        uVar11 = 0;
        do {
          if (uVar8 == uVar11) {
            if (uVar5 == nNodesMax) {
              return 0;
            }
            lVar7 = (long)(int)uVar5;
            uVar5 = uVar5 + 1;
            ppNodes[lVar7] = pCut2->ppLeaves[uVar6];
            break;
          }
          ppMVar1 = pCut1->ppLeaves + uVar11;
          uVar11 = uVar11 + 1;
        } while (pCut2->ppLeaves[uVar6] != *ppMVar1);
        uVar6 = uVar6 + 1;
      } while( true );
    }
    uVar6 = 0;
    uVar8 = 0;
    if (0 < nNodesMax) {
      uVar8 = (ulong)(uint)nNodesMax;
    }
    iVar12 = 0;
    while( true ) {
      if (uVar8 == uVar6) {
        for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
          ppNodes[uVar6] = pCut2->ppLeaves[uVar6];
        }
        return nNodesMax;
      }
      if ((*(Map_Node_t **)((long)pCut1 + uVar6 * 8 + (long)iVar12 * -8 + 0x18) !=
           pCut2->ppLeaves[uVar6]) && (bVar13 = iVar12 == 1, iVar12 = 1, bVar13)) break;
      uVar6 = uVar6 + 1;
    }
  }
  return 0;
}

Assistant:

int Map_CutMergeTwo( Map_Cut_t * pCut1, Map_Cut_t * pCut2, Map_Node_t * ppNodes[], int nNodesMax )
{
    Map_Node_t * pNodeTemp;
    int nTotal, i, k, min, fMismatch;

    // check the special case when at least of the cuts is the largest
    if ( pCut1->nLeaves == nNodesMax )
    {
        if ( pCut2->nLeaves == nNodesMax )
        {
            // return 0 if the cuts are different
            for ( i = 0; i < nNodesMax; i++ )
                if ( pCut1->ppLeaves[i] != pCut2->ppLeaves[i] )
                    return 0;
            // return nNodesMax if they are the same
            for ( i = 0; i < nNodesMax; i++ )
                ppNodes[i] = pCut1->ppLeaves[i];
            return nNodesMax;
        }
        else if ( pCut2->nLeaves == nNodesMax - 1 ) 
        {
            // return 0 if the cuts are different
            fMismatch = 0;
            for ( i = 0; i < nNodesMax; i++ )
                if ( pCut1->ppLeaves[i] != pCut2->ppLeaves[i - fMismatch] )
                {
                    if ( fMismatch == 1 )
                        return 0;
                    fMismatch = 1;
                }
            // return nNodesMax if they are the same
            for ( i = 0; i < nNodesMax; i++ )
                ppNodes[i] = pCut1->ppLeaves[i];
            return nNodesMax;
        }
    }
    else if ( pCut1->nLeaves == nNodesMax - 1 && pCut2->nLeaves == nNodesMax )
    {
        // return 0 if the cuts are different
        fMismatch = 0;
        for ( i = 0; i < nNodesMax; i++ )
            if ( pCut1->ppLeaves[i - fMismatch] != pCut2->ppLeaves[i] )
            {
                if ( fMismatch == 1 )
                    return 0;
                fMismatch = 1;
            }
        // return nNodesMax if they are the same
        for ( i = 0; i < nNodesMax; i++ )
            ppNodes[i] = pCut2->ppLeaves[i];
        return nNodesMax;
    }

    // count the number of unique entries in pCut2
    nTotal = pCut1->nLeaves;
    for ( i = 0; i < pCut2->nLeaves; i++ )
    {
        // try to find this entry among the leaves of pCut1
        for ( k = 0; k < pCut1->nLeaves; k++ )
            if ( pCut2->ppLeaves[i] == pCut1->ppLeaves[k] )
                break;
        if ( k < pCut1->nLeaves ) // found
            continue;
        // we found a new entry to add
        if ( nTotal == nNodesMax )
            return 0;
        ppNodes[nTotal++] = pCut2->ppLeaves[i];
    }
    // we know that the feasible cut exists

    // add the starting entries
    for ( k = 0; k < pCut1->nLeaves; k++ )
        ppNodes[k] = pCut1->ppLeaves[k];

    // selection-sort the entries
    for ( i = 0; i < nTotal - 1; i++ )
    {
        min = i;
        for ( k = i+1; k < nTotal; k++ )
//            if ( ppNodes[k] < ppNodes[min] ) // reported bug fix (non-determinism!)
            if ( ppNodes[k]->Num < ppNodes[min]->Num )
                min = k;
        pNodeTemp    = ppNodes[i];
        ppNodes[i]   = ppNodes[min];
        ppNodes[min] = pNodeTemp;
    }

    return nTotal;
}